

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

arth * gen_neg(compiler_state_t *cstate,arth *a)

{
  slist *psVar1;
  slist *psVar2;
  slist *psVar3;
  
  psVar2 = (slist *)newchunk(cstate,0x28);
  (psVar2->s).code = 0x60;
  (psVar2->s).k = a->regno;
  psVar1 = a->s;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3->next;
  } while (psVar1 != (slist *)0x0);
  psVar3->next = psVar2;
  psVar2 = (slist *)newchunk(cstate,0x28);
  (psVar2->s).code = 0x84;
  (psVar2->s).k = 0;
  psVar1 = a->s;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3->next;
  } while (psVar1 != (slist *)0x0);
  psVar3->next = psVar2;
  psVar2 = (slist *)newchunk(cstate,0x28);
  (psVar2->s).code = 2;
  (psVar2->s).k = a->regno;
  psVar1 = a->s;
  do {
    psVar3 = psVar1;
    psVar1 = psVar3->next;
  } while (psVar1 != (slist *)0x0);
  psVar3->next = psVar2;
  return a;
}

Assistant:

struct arth *
gen_neg(compiler_state_t *cstate, struct arth *a)
{
	struct slist *s;

	s = xfer_to_a(cstate, a);
	sappend(a->s, s);
	s = new_stmt(cstate, BPF_ALU|BPF_NEG);
	s->s.k = 0;
	sappend(a->s, s);
	s = new_stmt(cstate, BPF_ST);
	s->s.k = a->regno;
	sappend(a->s, s);

	return a;
}